

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImGui::ShadeVertsLinearUV
               (ImDrawList *draw_list,int vert_start_idx,int vert_end_idx,ImVec2 *a,ImVec2 *b,
               ImVec2 *uv_a,ImVec2 *uv_b,bool clamp)

{
  undefined8 uVar1;
  ImVec2 mx;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ImVec2 *in_R9;
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  byte in_stack_00000010;
  ImDrawVert *vertex_1;
  ImDrawVert *vertex;
  ImVec2 max;
  ImVec2 min;
  ImDrawVert *vert_end;
  ImDrawVert *vert_start;
  ImVec2 scale;
  ImVec2 uv_size;
  ImVec2 size;
  ImVec2 *in_stack_ffffffffffffff08;
  ImVec2 *pIVar13;
  ImVec2 *in_stack_ffffffffffffff10;
  ImVec2 *in_stack_ffffffffffffff18;
  ImVec2 *v;
  float in_stack_ffffffffffffff28;
  float _y;
  float local_cc;
  ImVec2 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  float *local_a8;
  undefined8 local_a0;
  ImVec2 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  float *local_70;
  undefined8 local_68;
  undefined8 local_60;
  float *local_58;
  float *local_50;
  ImVec2 local_44;
  undefined8 local_3c;
  undefined8 local_34;
  byte local_29;
  ImVec2 *local_28;
  int local_10;
  int local_c;
  long local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  
  local_29 = in_stack_00000010 & 1;
  local_28 = in_R9;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  auVar2._0_8_ = ::operator-(in_stack_ffffffffffffff08,(ImVec2 *)0x2205e2);
  auVar2._8_56_ = extraout_var;
  local_34 = vmovlpd_avx(auVar2._0_16_);
  auVar3._0_8_ = ::operator-(in_stack_ffffffffffffff08,(ImVec2 *)0x220600);
  auVar3._8_56_ = extraout_var_00;
  uVar1 = vmovlpd_avx(auVar3._0_16_);
  if (((float)local_34 != 0.0) || (NAN((float)local_34))) {
    local_3c._0_4_ = (float)uVar1;
    local_cc = (float)local_3c / (float)local_34;
  }
  else {
    local_cc = 0.0;
  }
  if ((local_34._4_4_ != 0.0) || (NAN(local_34._4_4_))) {
    local_3c._4_4_ = (float)((ulong)uVar1 >> 0x20);
    _y = local_3c._4_4_ / local_34._4_4_;
  }
  else {
    _y = 0.0;
  }
  local_3c = uVar1;
  ImVec2::ImVec2(&local_44,local_cc,_y);
  local_a8 = (float *)(*(long *)(local_8 + 0x28) + (long)local_c * 0x14);
  local_58 = (float *)(*(long *)(local_8 + 0x28) + (long)local_10 * 0x14);
  local_50 = local_a8;
  if ((local_29 & 1) == 0) {
    for (; local_a8 < local_58; local_a8 = local_a8 + 5) {
      pIVar13 = &local_c8;
      ImVec2::ImVec2(pIVar13,*local_a8,local_a8[1]);
      auVar10._0_8_ = ::operator-(pIVar13,(ImVec2 *)0x22088a);
      auVar10._8_56_ = extraout_var_07;
      local_c0 = vmovlpd_avx(auVar10._0_16_);
      auVar11._0_8_ = ImMul(pIVar13,(ImVec2 *)0x2208a2);
      auVar11._8_56_ = extraout_var_08;
      local_b8 = vmovlpd_avx(auVar11._0_16_);
      auVar12._0_8_ = ::operator+(pIVar13,(ImVec2 *)0x2208b7);
      auVar12._8_56_ = extraout_var_09;
      local_b0 = vmovlpd_avx(auVar12._0_16_);
      *(undefined8 *)(local_a8 + 2) = local_b0;
    }
  }
  else {
    auVar4._0_8_ = ImMin(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    auVar4._8_56_ = extraout_var_01;
    local_60 = vmovlpd_avx(auVar4._0_16_);
    auVar5._0_8_ = ImMax(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    auVar5._8_56_ = extraout_var_02;
    local_68 = vmovlpd_avx(auVar5._0_16_);
    for (local_70 = local_50; local_70 < local_58; local_70 = local_70 + 5) {
      pIVar13 = &local_98;
      v = local_28;
      ImVec2::ImVec2(pIVar13,*local_70,local_70[1]);
      auVar6._0_8_ = ::operator-(in_stack_ffffffffffffff08,(ImVec2 *)0x22079d);
      auVar6._8_56_ = extraout_var_03;
      local_90 = vmovlpd_avx(auVar6._0_16_);
      auVar7._0_8_ = ImMul(in_stack_ffffffffffffff08,(ImVec2 *)0x2207b5);
      auVar7._8_56_ = extraout_var_04;
      local_88 = vmovlpd_avx(auVar7._0_16_);
      auVar8._0_8_ = ::operator+(in_stack_ffffffffffffff08,(ImVec2 *)0x2207ca);
      auVar8._8_56_ = extraout_var_05;
      local_80 = vmovlpd_avx(auVar8._0_16_);
      local_a0 = local_68;
      mx.y = _y;
      mx.x = in_stack_ffffffffffffff28;
      auVar9._0_8_ = ImClamp(v,pIVar13,mx);
      auVar9._8_56_ = extraout_var_06;
      local_78 = vmovlpd_avx(auVar9._0_16_);
      *(undefined8 *)(local_70 + 2) = local_78;
    }
  }
  return;
}

Assistant:

void ImGui::ShadeVertsLinearUV(ImDrawList* draw_list, int vert_start_idx, int vert_end_idx, const ImVec2& a, const ImVec2& b, const ImVec2& uv_a, const ImVec2& uv_b, bool clamp)
{
    const ImVec2 size = b - a;
    const ImVec2 uv_size = uv_b - uv_a;
    const ImVec2 scale = ImVec2(
        size.x != 0.0f ? (uv_size.x / size.x) : 0.0f,
        size.y != 0.0f ? (uv_size.y / size.y) : 0.0f);

    ImDrawVert* vert_start = draw_list->VtxBuffer.Data + vert_start_idx;
    ImDrawVert* vert_end = draw_list->VtxBuffer.Data + vert_end_idx;
    if (clamp)
    {
        const ImVec2 min = ImMin(uv_a, uv_b);
        const ImVec2 max = ImMax(uv_a, uv_b);
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = ImClamp(uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale), min, max);
    }
    else
    {
        for (ImDrawVert* vertex = vert_start; vertex < vert_end; ++vertex)
            vertex->uv = uv_a + ImMul(ImVec2(vertex->pos.x, vertex->pos.y) - a, scale);
    }
}